

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O2

void accumulate_weighted_avg(vw *all,parameters *weights)

{
  uint32_t uVar1;
  ulong uVar2;
  float *buffer;
  weight *pwVar3;
  ostream *poVar4;
  byte bVar5;
  uint64_t n;
  uint64_t i;
  uint64_t uVar6;
  
  if (all->adaptive != false) {
    bVar5 = (byte)all->num_bits;
    n = 1L << (bVar5 & 0x3f);
    buffer = (float *)operator_new__(n * 4);
    if (weights->sparse == false) {
      uVar1 = (weights->dense_weights)._stride_shift;
      pwVar3 = (weights->dense_weights)._begin;
      uVar2 = (weights->dense_weights)._weight_mask;
      for (uVar6 = 0; n != uVar6; uVar6 = uVar6 + 1) {
        buffer[uVar6] = pwVar3[(uVar6 << ((byte)uVar1 & 0x3f) & uVar2) + 1];
      }
    }
    else {
      for (uVar6 = 0; n != uVar6; uVar6 = uVar6 + 1) {
        pwVar3 = sparse_parameters::operator[]
                           (&weights->sparse_weights,
                            uVar6 << ((byte)(weights->sparse_weights)._stride_shift & 0x3f));
        buffer[uVar6] = pwVar3[1];
      }
    }
    all_reduce<float,_&add_float>(all,buffer,n);
    if (weights->sparse == true) {
      do_weighting<sparse_parameters>(all,n,buffer,&weights->sparse_weights);
    }
    else {
      do_weighting<dense_parameters>(all,n,buffer,&weights->dense_weights);
    }
    if (weights->sparse == true) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "sparse parameters not supported with parallel computation!");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      all_reduce<float,_&add_float>
                (all,(weights->dense_weights)._begin,
                 (long)(1 << ((byte)(weights->dense_weights)._stride_shift & 0x1f)) <<
                 (bVar5 & 0x3f));
    }
    operator_delete__(buffer);
    return;
  }
  std::operator<<(&(all->trace_message).super_ostream,
                  "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n"
                 );
  return;
}

Assistant:

void accumulate_weighted_avg(vw& all, parameters& weights)
{
  if (!all.adaptive)
  {
    all.trace_message << "Weighted averaging is implemented only for adaptive gradient, use accumulate_avg instead\n";
    return;
  }
  uint32_t length = 1 << all.num_bits;  // This is the number of parameters
  float* local_weights = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[1];
  else
    for (uint64_t i = 0; i < length; i++)
      local_weights[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[1];

  // First compute weights for averaging
  all_reduce<float, add_float>(all, local_weights, length);

  if (weights.sparse)
    do_weighting(all, length, local_weights, weights.sparse_weights);
  else
    do_weighting(all, length, local_weights, weights.dense_weights);

  if (weights.sparse)
    cout << "sparse parameters not supported with parallel computation!" << endl;
  else
    all_reduce<float, add_float>(all, weights.dense_weights.first(), ((size_t)length) * (1 << weights.stride_shift()));
  delete[] local_weights;
}